

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::convert_etc1s_to_pvrtc2_rgb(void *pDst,endpoint *pEndpoints,selector *pSelector)

{
  long lVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint32_t b;
  uint32_t g;
  uint32_t r;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  
  *(uint *)((long)pDst + 4) = *(uint *)((long)pDst + 4) & 0x7fff7ffe | 0x80008000;
  bVar4 = pSelector->m_lo_selector;
  bVar5 = pSelector->m_hi_selector;
  bVar6 = pEndpoints->m_inten5;
  if (bVar4 == bVar5) {
    decoder_etc_block::get_block_color5(&pEndpoints->m_color5,(uint)bVar6,(uint)bVar4,&r,&g,&b);
    pvrtc2_block::set_low_color
              ((pvrtc2_block *)pDst,(uint)(byte)g_atc_match55_equals_1[(ulong)r * 2],
               (uint)(byte)g_atc_match55_equals_1[(ulong)g * 2],
               (uint)(byte)g_pvrtc2_match45_equals_1[(ulong)b * 2]);
    pvrtc2_block::set_high_color
              ((pvrtc2_block *)pDst,(uint)(byte)g_atc_match55_equals_1[(ulong)r * 2 + 1],
               (uint)(byte)g_atc_match55_equals_1[(ulong)g * 2 + 1],
               (uint)(byte)g_pvrtc2_match45_equals_1[(ulong)b * 2 + 1]);
    *(undefined4 *)pDst = 0x55555555;
  }
  else {
    if ((((bVar6 < 7) || (bVar5 != 3)) || (bVar4 != 0)) ||
       (pSelector->m_num_unique_selectors != '\x02')) {
      iVar8 = (uint)bVar6 * 0x20;
      iVar11 = *(int *)(g_etc1s_to_atc_selector_range_index + (ulong)bVar5 * 4 + (ulong)bVar4 * 0x10
                       ) * 10;
      lVar1 = (ulong)(((uint)(pEndpoints->m_color5).field_0.field_0.r + iVar8) * 0x3c + iVar11) * 4;
      lVar2 = (ulong)(((uint)(pEndpoints->m_color5).field_0.field_0.g + iVar8) * 0x3c + iVar11) * 4;
      lVar3 = (ulong)(((uint)(pEndpoints->m_color5).field_0.field_0.b + iVar8) * 0x3c + iVar11) * 4;
      uVar9 = (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar3 + 2) +
              (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar2 + 2) +
              (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar1 + 2);
      uVar12 = (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar3 + 6) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar2 + 6) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar1 + 6);
      uVar13 = uVar12;
      if (uVar12 >= uVar9) {
        uVar13 = uVar9;
      }
      uVar10 = (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar3 + 10) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar2 + 10) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar1 + 10);
      uVar15 = 2;
      if (uVar13 <= uVar10) {
        uVar15 = (uint)(uVar12 < uVar9);
        uVar10 = uVar13;
      }
      uVar13 = (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar3 + 0xe) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar2 + 0xe) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar1 + 0xe);
      uVar9 = 3;
      if (uVar10 <= uVar13) {
        uVar13 = uVar10;
        uVar9 = uVar15;
      }
      uVar12 = (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar3 + 0x12) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar2 + 0x12) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar1 + 0x12);
      uVar10 = 4;
      if (uVar13 <= uVar12) {
        uVar12 = uVar13;
        uVar10 = uVar9;
      }
      uVar13 = (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar3 + 0x16) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar2 + 0x16) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar1 + 0x16);
      uVar9 = 5;
      if (uVar12 <= uVar13) {
        uVar13 = uVar12;
        uVar9 = uVar10;
      }
      uVar12 = (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar3 + 0x1a) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar2 + 0x1a) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar1 + 0x1a);
      uVar10 = 6;
      if (uVar13 <= uVar12) {
        uVar12 = uVar13;
        uVar10 = uVar9;
      }
      uVar13 = (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar3 + 0x1e) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar2 + 0x1e) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar1 + 0x1e);
      uVar9 = 7;
      if (uVar12 <= uVar13) {
        uVar13 = uVar12;
        uVar9 = uVar10;
      }
      uVar12 = (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar3 + 0x22) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar2 + 0x22) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar1 + 0x22);
      uVar16 = 8;
      if (uVar13 <= uVar12) {
        uVar16 = (ulong)uVar9;
        uVar12 = uVar13;
      }
      uVar14 = 9;
      if (uVar12 <= (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar3 + 0x26) +
                    (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar2 + 0x26) +
                    (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar1 + 0x26)) {
        uVar14 = uVar16;
      }
      pvrtc2_block::set_low_color
                ((pvrtc2_block *)pDst,(uint)(byte)g_etc1s_to_atc_55[uVar14 * 4 + lVar1],
                 (uint)(byte)g_etc1s_to_atc_55[uVar14 * 4 + lVar2],
                 (uint)(byte)g_etc1s_to_pvrtc2_45[uVar14 * 4 + lVar3]);
      pvrtc2_block::set_high_color
                ((pvrtc2_block *)pDst,(uint)*(byte *)(lVar1 + 0x2b55b1 + uVar14 * 4),
                 (uint)*(byte *)(lVar2 + 0x2b55b1 + uVar14 * 4),
                 (uint)*(byte *)(lVar3 + 0x2d35e1 + uVar14 * 4));
      if ((int)uVar14 != 6) {
        bVar4 = pSelector->m_selectors[0];
        bVar5 = pSelector->m_selectors[1];
        bVar6 = pSelector->m_selectors[2];
        bVar7 = pSelector->m_selectors[3];
        auVar17 = psllw(ZEXT416(CONCAT13((&g_etc1s_to_atc_selector_mappings)
                                         [(ulong)(bVar7 >> 2 & 3) + uVar14 * 4],
                                         CONCAT12((&g_etc1s_to_atc_selector_mappings)
                                                  [(ulong)(bVar6 >> 2 & 3) + uVar14 * 4],
                                                  CONCAT11((&g_etc1s_to_atc_selector_mappings)
                                                           [(ulong)(bVar5 >> 2 & 3) + uVar14 * 4],
                                                           (&g_etc1s_to_atc_selector_mappings)
                                                           [(ulong)(bVar4 >> 2 & 3) + uVar14 * 4])))
                               ),2);
        auVar18 = psllw(ZEXT416(CONCAT13((&g_etc1s_to_atc_selector_mappings)
                                         [(ulong)(bVar7 >> 4 & 3) + uVar14 * 4],
                                         CONCAT12((&g_etc1s_to_atc_selector_mappings)
                                                  [(ulong)(bVar6 >> 4 & 3) + uVar14 * 4],
                                                  CONCAT11((&g_etc1s_to_atc_selector_mappings)
                                                           [(ulong)(bVar5 >> 4 & 3) + uVar14 * 4],
                                                           (&g_etc1s_to_atc_selector_mappings)
                                                           [(ulong)(bVar4 >> 4 & 3) + uVar14 * 4])))
                               ),4);
        auVar19 = psllw(ZEXT416(CONCAT13((&g_etc1s_to_atc_selector_mappings)
                                         [(ulong)(bVar7 >> 6) + uVar14 * 4],
                                         CONCAT12((&g_etc1s_to_atc_selector_mappings)
                                                  [(ulong)(bVar6 >> 6) + uVar14 * 4],
                                                  CONCAT11((&g_etc1s_to_atc_selector_mappings)
                                                           [(ulong)(bVar5 >> 6) + uVar14 * 4],
                                                           (&g_etc1s_to_atc_selector_mappings)
                                                           [(ulong)(bVar4 >> 6) + uVar14 * 4])))),6)
        ;
        *(uint *)pDst =
             auVar19._0_4_ & (uint)DAT_00264440 | auVar18._0_4_ & (uint)DAT_00264430 |
             CONCAT13((&g_etc1s_to_atc_selector_mappings)[(ulong)(bVar7 & 3) + uVar14 * 4],
                      CONCAT12((&g_etc1s_to_atc_selector_mappings)[(ulong)(bVar6 & 3) + uVar14 * 4],
                               CONCAT11((&g_etc1s_to_atc_selector_mappings)
                                        [(ulong)(bVar5 & 3) + uVar14 * 4],
                                        (&g_etc1s_to_atc_selector_mappings)
                                        [(ulong)(bVar4 & 3) + uVar14 * 4]))) |
             auVar17._0_4_ & (uint)DAT_00264420;
        return;
      }
    }
    else {
      decoder_etc_block::get_block_colors5((color32 *)&r,&pEndpoints->m_color5,(uint)bVar6);
      pvrtc2_block::set_low_color
                ((pvrtc2_block *)pDst,(uint)(byte)g_atc_match5[(ulong)(byte)r * 2 + 1],
                 (uint)(byte)g_atc_match5[(ulong)r._1_1_ * 2 + 1],
                 (uint)(byte)g_pvrtc2_match4[(ulong)r._2_1_ * 2 + 1]);
      pvrtc2_block::set_high_color
                ((pvrtc2_block *)pDst,(uint)(byte)g_atc_match5[(ulong)local_3c * 2 + 1],
                 (uint)(byte)g_atc_match5[(ulong)local_3b * 2 + 1],
                 (uint)(byte)g_atc_match5[(ulong)local_3a * 2 + 1]);
    }
    *(uint8_t *)pDst = pSelector->m_selectors[0];
    *(uint8_t *)((long)pDst + 1) = pSelector->m_selectors[1];
    *(uint8_t *)((long)pDst + 2) = pSelector->m_selectors[2];
    *(uint8_t *)((long)pDst + 3) = pSelector->m_selectors[3];
  }
  return;
}

Assistant:

static void convert_etc1s_to_pvrtc2_rgb(void* pDst, const endpoint* pEndpoints, const selector* pSelector)
	{
		pvrtc2_block* pBlock = static_cast<pvrtc2_block*>(pDst);

		pBlock->m_opaque_color_data.m_hard_flag = 1;
		pBlock->m_opaque_color_data.m_mod_flag = 0;
		pBlock->m_opaque_color_data.m_opaque_flag = 1;

		const uint32_t low_selector = pSelector->m_lo_selector;
		const uint32_t high_selector = pSelector->m_hi_selector;

		const color32& base_color = pEndpoints->m_color5;
		const uint32_t inten_table = pEndpoints->m_inten5;

		if (low_selector == high_selector)
		{
			uint32_t r, g, b;
			decoder_etc_block::get_block_color5(base_color, inten_table, low_selector, r, g, b);

			pBlock->set_low_color(g_atc_match55_equals_1[r].m_lo, g_atc_match55_equals_1[g].m_lo, g_pvrtc2_match45_equals_1[b].m_lo);
			pBlock->set_high_color(g_atc_match55_equals_1[r].m_hi, g_atc_match55_equals_1[g].m_hi, g_pvrtc2_match45_equals_1[b].m_hi);

			pBlock->m_modulation[0] = 0x55;
			pBlock->m_modulation[1] = 0x55;
			pBlock->m_modulation[2] = 0x55;
			pBlock->m_modulation[3] = 0x55;

			return;
		}
		else if ((inten_table >= 7) && (pSelector->m_num_unique_selectors == 2) && (pSelector->m_lo_selector == 0) && (pSelector->m_hi_selector == 3))
		{
			color32 block_colors[4];
			decoder_etc_block::get_block_colors5(block_colors, base_color, inten_table);

			const uint32_t r0 = block_colors[0].r;
			const uint32_t g0 = block_colors[0].g;
			const uint32_t b0 = block_colors[0].b;

			const uint32_t r1 = block_colors[3].r;
			const uint32_t g1 = block_colors[3].g;
			const uint32_t b1 = block_colors[3].b;

			pBlock->set_low_color(g_atc_match5[r0].m_hi, g_atc_match5[g0].m_hi, g_pvrtc2_match4[b0].m_hi);
			pBlock->set_high_color(g_atc_match5[r1].m_hi, g_atc_match5[g1].m_hi, g_atc_match5[b1].m_hi);

			pBlock->m_modulation[0] = pSelector->m_selectors[0];
			pBlock->m_modulation[1] = pSelector->m_selectors[1];
			pBlock->m_modulation[2] = pSelector->m_selectors[2];
			pBlock->m_modulation[3] = pSelector->m_selectors[3];

			return;
		}

		const uint32_t selector_range_table = g_etc1s_to_atc_selector_range_index[low_selector][high_selector];

		//[32][8][RANGES][MAPPING]
		const etc1s_to_atc_solution* pTable_r = &g_etc1s_to_atc_55[(inten_table * 32 + base_color.r) * (NUM_ETC1S_TO_ATC_SELECTOR_RANGES * NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS) + selector_range_table * NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS];
		const etc1s_to_atc_solution* pTable_g = &g_etc1s_to_atc_55[(inten_table * 32 + base_color.g) * (NUM_ETC1S_TO_ATC_SELECTOR_RANGES * NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS) + selector_range_table * NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS];
		const etc1s_to_atc_solution* pTable_b = &g_etc1s_to_pvrtc2_45[(inten_table * 32 + base_color.b) * (NUM_ETC1S_TO_ATC_SELECTOR_RANGES * NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS) + selector_range_table * NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS];

		uint32_t best_err = UINT_MAX;
		uint32_t best_mapping = 0;

		assert(NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS == 10);
#define DO_ITER(m) { uint32_t total_err = pTable_r[m].m_err + pTable_g[m].m_err + pTable_b[m].m_err; if (total_err < best_err) { best_err = total_err; best_mapping = m; } }
		DO_ITER(0); DO_ITER(1); DO_ITER(2); DO_ITER(3); DO_ITER(4);
		DO_ITER(5); DO_ITER(6); DO_ITER(7); DO_ITER(8); DO_ITER(9);
#undef DO_ITER

		pBlock->set_low_color(pTable_r[best_mapping].m_lo, pTable_g[best_mapping].m_lo, pTable_b[best_mapping].m_lo);
		pBlock->set_high_color(pTable_r[best_mapping].m_hi, pTable_g[best_mapping].m_hi, pTable_b[best_mapping].m_hi);

		if (ATC_IDENTITY_SELECTOR_MAPPING_INDEX == best_mapping)
		{
			pBlock->m_modulation[0] = pSelector->m_selectors[0];
			pBlock->m_modulation[1] = pSelector->m_selectors[1];
			pBlock->m_modulation[2] = pSelector->m_selectors[2];
			pBlock->m_modulation[3] = pSelector->m_selectors[3];
		}
		else
		{
			// TODO: We could make this faster using several precomputed 256 entry tables, like ETC1S->BC1 does.
			const uint8_t* pSelectors_xlat = &g_etc1s_to_atc_selector_mappings[best_mapping][0];

			const uint32_t sel_bits0 = pSelector->m_selectors[0];
			const uint32_t sel_bits1 = pSelector->m_selectors[1];
			const uint32_t sel_bits2 = pSelector->m_selectors[2];
			const uint32_t sel_bits3 = pSelector->m_selectors[3];

			uint32_t sels0 = 0, sels1 = 0, sels2 = 0, sels3 = 0;

#define DO_X(x) { \
			const uint32_t x_shift = (x) * 2; \
			sels0 |= (pSelectors_xlat[(sel_bits0 >> x_shift) & 3] << x_shift); \
			sels1 |= (pSelectors_xlat[(sel_bits1 >> x_shift) & 3] << x_shift); \
			sels2 |= (pSelectors_xlat[(sel_bits2 >> x_shift) & 3] << x_shift); \
			sels3 |= (pSelectors_xlat[(sel_bits3 >> x_shift) & 3] << x_shift); }

			DO_X(0);
			DO_X(1);
			DO_X(2);
			DO_X(3);
#undef DO_X

			pBlock->m_modulation[0] = (uint8_t)sels0;
			pBlock->m_modulation[1] = (uint8_t)sels1;
			pBlock->m_modulation[2] = (uint8_t)sels2;
			pBlock->m_modulation[3] = (uint8_t)sels3;
		}
	}